

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

ZSTD_OffsetInfo ZSTD_getOffsetInfo(ZSTD_seqSymbol *offTable,int nbSeq)

{
  ZSTD_OffsetInfo ZVar1;
  uint uVar2;
  byte bVar3;
  uint local_44;
  uint local_40;
  U32 u;
  U32 max;
  ZSTD_seqSymbol *table;
  U32 tableLog;
  void *ptr;
  int nbSeq_local;
  ZSTD_seqSymbol *offTable_local;
  ZSTD_OffsetInfo info;
  
  memset(&offTable_local,0,8);
  if (nbSeq != 0) {
    bVar3 = (byte)offTable->baseValue;
    uVar2 = 1 << (bVar3 & 0x1f);
    if (0x100 < uVar2) {
      __assert_fail("max <= (1 << OffFSELog)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x7dd,"ZSTD_OffsetInfo ZSTD_getOffsetInfo(const ZSTD_seqSymbol *, int)");
    }
    for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
      if (offTable[(ulong)local_40 + 1].nbAdditionalBits < offTable_local._4_4_) {
        local_44 = offTable_local._4_4_;
      }
      else {
        local_44 = (uint)offTable[(ulong)local_40 + 1].nbAdditionalBits;
      }
      offTable_local._4_4_ = local_44;
      if (0x16 < offTable[(ulong)local_40 + 1].nbAdditionalBits) {
        offTable_local._0_4_ = (uint)offTable_local + 1;
      }
    }
    if (8 < offTable->baseValue) {
      __assert_fail("tableLog <= OffFSELog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x7e3,"ZSTD_OffsetInfo ZSTD_getOffsetInfo(const ZSTD_seqSymbol *, int)");
    }
    offTable_local._0_4_ = (uint)offTable_local << (8 - bVar3 & 0x1f);
  }
  ZVar1.maxNbAdditionalBits = offTable_local._4_4_;
  ZVar1.longOffsetShare = (uint)offTable_local;
  return ZVar1;
}

Assistant:

static ZSTD_OffsetInfo
ZSTD_getOffsetInfo(const ZSTD_seqSymbol* offTable, int nbSeq)
{
    ZSTD_OffsetInfo info = {0, 0};
    /* If nbSeq == 0, then the offTable is uninitialized, but we have
     * no sequences, so both values should be 0.
     */
    if (nbSeq != 0) {
        const void* ptr = offTable;
        U32 const tableLog = ((const ZSTD_seqSymbol_header*)ptr)[0].tableLog;
        const ZSTD_seqSymbol* table = offTable + 1;
        U32 const max = 1 << tableLog;
        U32 u;
        DEBUGLOG(5, "ZSTD_getLongOffsetsShare: (tableLog=%u)", tableLog);

        assert(max <= (1 << OffFSELog));  /* max not too large */
        for (u=0; u<max; u++) {
            info.maxNbAdditionalBits = MAX(info.maxNbAdditionalBits, table[u].nbAdditionalBits);
            if (table[u].nbAdditionalBits > 22) info.longOffsetShare += 1;
        }

        assert(tableLog <= OffFSELog);
        info.longOffsetShare <<= (OffFSELog - tableLog);  /* scale to OffFSELog */
    }

    return info;
}